

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O2

void __thiscall CUI::UpdateClipping(CUI *this)

{
  int iVar1;
  CUIRect *pCVar2;
  CUIRect *pCVar3;
  float fVar4;
  float fVar5;
  
  if (this->m_NumClips != 0) {
    pCVar2 = ClipArea(this);
    iVar1 = this->m_pGraphics->m_ScreenWidth;
    pCVar3 = Screen(this);
    fVar4 = (float)iVar1 / pCVar3->w;
    iVar1 = this->m_pGraphics->m_ScreenHeight;
    pCVar3 = Screen(this);
    fVar5 = (float)iVar1 / pCVar3->h;
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[3])
              (this->m_pGraphics,(ulong)(uint)(int)(pCVar2->x * fVar4),
               (ulong)(uint)(int)(pCVar2->y * fVar5),(ulong)(uint)(int)(fVar4 * pCVar2->w),
               (ulong)(uint)(int)(fVar5 * pCVar2->h));
    return;
  }
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[4])();
  return;
}

Assistant:

void CUI::UpdateClipping()
{
	if(IsClipped())
	{
		const CUIRect *pRect = ClipArea();
		const float XScale = Graphics()->ScreenWidth()/Screen()->w;
		const float YScale = Graphics()->ScreenHeight()/Screen()->h;
		Graphics()->ClipEnable((int)(pRect->x*XScale), (int)(pRect->y*YScale), (int)(pRect->w*XScale), (int)(pRect->h*YScale));
	}
	else
	{
		Graphics()->ClipDisable();
	}
}